

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::getCompareDependencies
               (set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                *compareFuncs,DataType basicType)

{
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *this;
  int vecSize;
  pair<std::_Rb_tree_const_iterator<glu::DataType>,_bool> pVar1;
  DataType local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  value_type local_3c [5];
  _Base_ptr local_28;
  undefined1 local_20;
  value_type local_18;
  DataType local_14;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *psStack_10;
  DataType basicType_local;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *compareFuncs_local;
  
  local_14 = basicType;
  psStack_10 = compareFuncs;
  if (basicType - TYPE_FLOAT_VEC2 < 3) {
    local_18 = TYPE_FLOAT;
    pVar1 = std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::
            insert(compareFuncs,&local_18);
    local_28 = (_Base_ptr)pVar1.first._M_node;
    local_20 = pVar1.second;
    std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::insert
              (psStack_10,&local_14);
  }
  else if (basicType - TYPE_FLOAT_MAT2 < 9) {
    local_3c[0] = TYPE_FLOAT;
    pVar1 = std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::
            insert(compareFuncs,local_3c);
    this = psStack_10;
    local_50 = (_Base_ptr)pVar1.first._M_node;
    local_48 = pVar1.second;
    vecSize = glu::getDataTypeMatrixNumRows(local_14);
    local_54 = glu::getDataTypeFloatVec(vecSize);
    std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::insert
              (this,&local_54);
    std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::insert
              (psStack_10,&local_14);
  }
  else {
    std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::insert
              (compareFuncs,&local_14);
  }
  return;
}

Assistant:

void getCompareDependencies (std::set<glu::DataType>& compareFuncs, glu::DataType basicType)
{
	switch (basicType)
	{
		case glu::TYPE_FLOAT_VEC2:
		case glu::TYPE_FLOAT_VEC3:
		case glu::TYPE_FLOAT_VEC4:
			compareFuncs.insert(glu::TYPE_FLOAT);
			compareFuncs.insert(basicType);
			break;

		case glu::TYPE_FLOAT_MAT2:
		case glu::TYPE_FLOAT_MAT2X3:
		case glu::TYPE_FLOAT_MAT2X4:
		case glu::TYPE_FLOAT_MAT3X2:
		case glu::TYPE_FLOAT_MAT3:
		case glu::TYPE_FLOAT_MAT3X4:
		case glu::TYPE_FLOAT_MAT4X2:
		case glu::TYPE_FLOAT_MAT4X3:
		case glu::TYPE_FLOAT_MAT4:
			compareFuncs.insert(glu::TYPE_FLOAT);
			compareFuncs.insert(glu::getDataTypeFloatVec(glu::getDataTypeMatrixNumRows(basicType)));
			compareFuncs.insert(basicType);
			break;

		default:
			compareFuncs.insert(basicType);
			break;
	}
}